

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O3

pair<pstore::index::details::index_pointer,_bool> __thiscall
pstore::index::
hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
::insert_node<std::pair<std::__cxx11::string,std::__cxx11::string>>
          (hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
           *this,transaction_base *transaction,index_pointer node,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *value,hash_type hash,uint shifts,
          not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents,
          bool is_upsert)

{
  size_t __n;
  ulong uVar1;
  int iVar2;
  uint64_t uVar3;
  size_t sVar4;
  index_pointer leaf;
  internal_node *piVar5;
  index_pointer *piVar6;
  address aVar7;
  address *paVar8;
  not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> nVar9;
  uint shifts_00;
  undefined7 uVar11;
  ulong uVar10;
  index_pointer iVar12;
  pair<pstore::index::details::index_pointer,_bool> pVar13;
  pair<const_pstore::index::details::index_pointer,_unsigned_long> pVar14;
  key_type existing_key;
  index_pointer node_local;
  database *local_40;
  index_pointer local_38;
  
  uVar11 = (undefined7)(hash >> 8);
  node_local = node;
  if (((ulong)node.internal_ & 1) == 0) {
    if (((ulong)node.internal_ & 2) != 0) {
      __assert_fail("is_address ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map_types.hpp"
                    ,0xe3,"address pstore::index::details::index_pointer::to_address() const");
    }
    local_40 = transaction->db_;
    nVar9.ptr_ = (array_stack<pstore::index::details::parent_type,_13UL> *)value;
    local_38 = node;
    serialize::read<std::__cxx11::string,pstore::serialize::archive::database_reader>
              (&existing_key,(serialize *)&local_40,(database_reader *)node.internal_);
    __n = (value->first)._M_string_length;
    if ((__n == existing_key._M_string_length) &&
       ((__n == 0 ||
        (iVar2 = bcmp((value->first)._M_dataplus._M_p,existing_key._M_dataplus._M_p,__n), iVar2 == 0
        )))) {
      if (is_upsert) {
        node.addr_.a_ =
             store_leaf_node<std::pair<std::__cxx11::string,std::__cxx11::string>>
                       ((hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
                         *)transaction,(transaction_base *)value,
                        (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)parents.ptr_,nVar9);
      }
      else {
        uVar10 = (parents.ptr_)->elements_;
        if (0xc < uVar10) {
          assert_failed("elements_ < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                        ,100);
        }
        (parents.ptr_)->elements_ = uVar10 + 1;
        ((parents.ptr_)->c_)._M_elems[uVar10].node = node;
        ((parents.ptr_)->c_)._M_elems[uVar10].position = 0xffffffffffffffff;
      }
      uVar10 = CONCAT71(uVar11,1);
    }
    else {
      uVar3 = anon_unknown.dwarf_18bb43::hash_function::operator()
                        ((hash_function *)(this + 0x28),&existing_key);
      node = insert_into_leaf<std::pair<std::__cxx11::string,std::__cxx11::string>>
                       (this,transaction,&node_local,value,uVar3 >> ((byte)shifts & 0x3f),hash,
                        shifts,parents);
      uVar10 = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)existing_key._M_dataplus._M_p != &existing_key.field_2) {
      operator_delete(existing_key._M_dataplus._M_p,existing_key.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (shifts < 0x42) {
      details::internal_node::get_node
                ((pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
                  *)&existing_key,transaction->db_,node);
      if (existing_key.field_2._M_allocated_capacity == 0) {
        assert_failed("internal != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                      ,0x32c);
      }
      nVar9.ptr_ = *(array_stack<pstore::index::details::parent_type,_13UL> **)
                    (existing_key.field_2._M_allocated_capacity + 8);
      if (((ulong)nVar9.ptr_ >> (hash & 0x3f) & 1) == 0) {
        piVar5 = details::internal_node::
                 make_writable<pstore::chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>,void>
                           (*(chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>
                              **)(this + 8),node,
                            (internal_node *)existing_key.field_2._M_allocated_capacity);
        leaf.addr_.a_ =
             store_leaf_node<std::pair<std::__cxx11::string,std::__cxx11::string>>
                       ((hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
                         *)transaction,(transaction_base *)value,
                        (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)parents.ptr_,nVar9);
        details::internal_node::insert_child(piVar5,hash,leaf,parents);
        node.internal_ = piVar5 | 3;
        uVar10 = 0;
      }
      else {
        sVar4 = POPCOUNT((ulong)nVar9.ptr_ & (1L << ((byte)hash & 0x3f)) - 1U);
        iVar12 = *(index_pointer *)(existing_key.field_2._M_allocated_capacity + 0x10 + sVar4 * 8);
        pVar13 = insert_node<std::pair<std::__cxx11::string,std::__cxx11::string>>
                           (this,transaction,iVar12,value,hash >> 6,shifts + 6,parents,is_upsert);
        uVar10 = (ulong)pVar13._8_4_;
        if (pVar13.first.internal_ != iVar12.internal_) {
          piVar5 = details::internal_node::
                   make_writable<pstore::chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>,void>
                             (*(chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>
                                **)(this + 8),node,
                              (internal_node *)existing_key.field_2._M_allocated_capacity);
          piVar6 = details::internal_node::operator[](piVar5,sVar4);
          iVar12.addr_.a_._4_4_ = 0;
          iVar12.addr_.a_._0_4_ = shifts + 6;
          hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::delete_node((hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)piVar6->internal_,iVar12,shifts_00);
          piVar6->internal_ = (internal_node *)pVar13.first;
          node.internal_ = piVar5 | 3;
        }
        uVar1 = (parents.ptr_)->elements_;
        if (0xc < uVar1) {
          assert_failed("elements_ < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                        ,100);
        }
        (parents.ptr_)->elements_ = uVar1 + 1;
        ((parents.ptr_)->c_)._M_elems[uVar1].node.internal_ = (internal_node *)node;
        ((parents.ptr_)->c_)._M_elems[uVar1].position = sVar4;
      }
    }
    else {
      nVar9.ptr_ = (array_stack<pstore::index::details::parent_type,_13UL> *)value;
      details::linear_node::get_node
                ((pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                  *)&existing_key,transaction->db_,node);
      if (existing_key.field_2._M_allocated_capacity == 0) {
        assert_failed("orig_node != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                      ,0x368);
      }
      pVar14 = details::linear_node::
               lookup<std::__cxx11::string,std::__cxx11::string,std::equal_to<std::__cxx11::string>,void>
                         ((linear_node *)existing_key.field_2._M_allocated_capacity,transaction->db_
                          ,value);
      sVar4 = pVar14.second;
      if (sVar4 == 0xffffffffffffffff) {
        details::linear_node::allocate_from
                  ((linear_node *)&existing_key,
                   (linear_node *)existing_key.field_2._M_allocated_capacity,1);
        sVar4 = *(size_t *)(existing_key.field_2._M_allocated_capacity + 8);
        aVar7 = store_leaf_node<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
                            *)transaction,(transaction_base *)value,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)parents.ptr_,nVar9);
        paVar8 = details::linear_node::operator[]
                           ((linear_node *)existing_key._M_dataplus._M_p,sVar4);
        paVar8->a_ = aVar7.a_;
        node.internal_ = (internal_node *)((ulong)existing_key._M_dataplus._M_p | 3);
        uVar10 = 0;
      }
      else if (is_upsert) {
        if (((ulong)node.internal_ & 2) == 0) {
          details::linear_node::allocate_from
                    ((linear_node *)&existing_key,
                     (linear_node *)existing_key.field_2._M_allocated_capacity,0);
          node.internal_ = (internal_node *)((ulong)existing_key._M_dataplus._M_p | 3);
        }
        else {
          existing_key._M_dataplus._M_p = (pointer)((ulong)node.internal_ & 0xfffffffffffffffc);
        }
        aVar7 = store_leaf_node<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
                            *)transaction,(transaction_base *)value,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)parents.ptr_,nVar9);
        paVar8 = details::linear_node::operator[]
                           ((linear_node *)existing_key._M_dataplus._M_p,sVar4);
        paVar8->a_ = aVar7.a_;
        uVar10 = CONCAT71(uVar11,1);
      }
      else {
        aVar7 = details::linear_node::operator[]
                          ((linear_node *)existing_key.field_2._M_allocated_capacity,sVar4);
        uVar10 = (parents.ptr_)->elements_;
        if (0xc < uVar10) {
          assert_failed("elements_ < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                        ,100);
        }
        (parents.ptr_)->elements_ = uVar10 + 1;
        ((parents.ptr_)->c_)._M_elems[uVar10].node.addr_.a_ = aVar7.a_;
        ((parents.ptr_)->c_)._M_elems[uVar10].position = 0xffffffffffffffff;
        uVar10 = CONCAT71(uVar11,1);
      }
      uVar1 = (parents.ptr_)->elements_;
      if (0xc < uVar1) {
        assert_failed("elements_ < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                      ,100);
      }
      (parents.ptr_)->elements_ = uVar1 + 1;
      ((parents.ptr_)->c_)._M_elems[uVar1].node.internal_ = (internal_node *)node;
      ((parents.ptr_)->c_)._M_elems[uVar1].position = sVar4;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)existing_key._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)existing_key._M_string_length);
    }
  }
  pVar13._8_8_ = uVar10 & 0xffffffff;
  pVar13.first = node;
  return pVar13;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::insert_node (
            transaction_base & transaction, index_pointer const node, OtherValueType const & value,
            hash_type hash, unsigned shifts, gsl::not_null<parent_stack *> parents, bool is_upsert)
            -> std::pair<index_pointer, bool> {

            index_pointer result;
            bool key_exists = false;
            if (node.is_leaf ()) { // This node is a leaf node.
                key_type const existing_key =
                    get_key (transaction.db (), node.to_address ()); // Read key.
                if (equal_ (value.first, existing_key)) {
                    if (is_upsert) {
                        result = this->store_leaf_node (transaction, value, parents);
                    } else {
                        parents->push (details::parent_type{node});
                        result = node;
                    }
                    key_exists = true;
                } else {
                    auto const existing_hash =
                        static_cast<hash_type> ((hash_ (existing_key) >> shifts));
                    result = this->insert_into_leaf (transaction, node, value, existing_hash, hash,
                                                     shifts, parents);
                }
            } else {
                // This node is an internal or a linear node.
                if (details::depth_is_internal_node (shifts)) {
                    std::tie (result, key_exists) = this->insert_into_internal (
                        transaction, node, value, hash, shifts, parents, is_upsert);
                } else {
                    std::tie (result, key_exists) =
                        this->insert_into_linear (transaction, node, value, parents, is_upsert);
                }
            }

            return std::make_pair (result, key_exists);
        }